

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O0

void zdd_refs_mark_task_TOGETHER(void)

{
  TD_zdd_refs_mark_task *t;
  Task _t;
  
  t = (TD_zdd_refs_mark_task *)zdd_refs_mark_task_WRAP;
  _t.f = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x1;
  lace_run_together((Task *)&t);
  return;
}

Assistant:

VOID_TASK_0(zdd_refs_mark_task)
{
    LOCALIZE_THREAD_LOCAL(zdd_refs_key, zdd_refs_internal_t);
    SPAWN(zdd_refs_mark_p_par, zdd_refs_key->pbegin, zdd_refs_key->pcur-zdd_refs_key->pbegin);
    SPAWN(zdd_refs_mark_r_par, zdd_refs_key->rbegin, zdd_refs_key->rcur-zdd_refs_key->rbegin);
    CALL(zdd_refs_mark_s_par, zdd_refs_key->sbegin, zdd_refs_key->scur-zdd_refs_key->sbegin);
    SYNC(zdd_refs_mark_r_par);
    SYNC(zdd_refs_mark_p_par);
}